

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlnamePush(htmlParserCtxtPtr ctxt,xmlChar *value)

{
  int iVar1;
  xmlChar **ppxVar2;
  xmlChar *value_local;
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->html < 3) && (iVar1 = xmlStrEqual(value,"head"), iVar1 != 0)) {
    ctxt->html = 3;
  }
  if ((ctxt->html < 10) && (iVar1 = xmlStrEqual(value,"body"), iVar1 != 0)) {
    ctxt->html = 10;
  }
  if (ctxt->nameMax <= ctxt->nameNr) {
    ctxt->nameMax = ctxt->nameMax << 1;
    ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,(long)ctxt->nameMax << 3);
    ctxt->nameTab = ppxVar2;
    if (ctxt->nameTab == (xmlChar **)0x0) {
      htmlErrMemory(ctxt,(char *)0x0);
      return 0;
    }
  }
  ctxt->nameTab[ctxt->nameNr] = value;
  ctxt->name = value;
  iVar1 = ctxt->nameNr;
  ctxt->nameNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
htmlnamePush(htmlParserCtxtPtr ctxt, const xmlChar * value)
{
    if ((ctxt->html < 3) && (xmlStrEqual(value, BAD_CAST "head")))
        ctxt->html = 3;
    if ((ctxt->html < 10) && (xmlStrEqual(value, BAD_CAST "body")))
        ctxt->html = 10;
    if (ctxt->nameNr >= ctxt->nameMax) {
        ctxt->nameMax *= 2;
        ctxt->nameTab = (const xmlChar * *)
                         xmlRealloc((xmlChar * *)ctxt->nameTab,
                                    ctxt->nameMax *
                                    sizeof(ctxt->nameTab[0]));
        if (ctxt->nameTab == NULL) {
            htmlErrMemory(ctxt, NULL);
            return (0);
        }
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    return (ctxt->nameNr++);
}